

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O3

void shim_vkGetPhysicalDeviceFeatures2KHR
               (VkPhysicalDevice physicalDevice,VkPhysicalDeviceFeatures2 *pFeatures)

{
  int *__dest;
  pointer pvVar1;
  int *__src;
  undefined8 uVar2;
  PhysicalDeviceDetails *pPVar3;
  pointer pvVar4;
  
  pPVar3 = get_physical_device_details(physicalDevice);
  memcpy(&pFeatures->features,&pPVar3->features,0xdc);
  pPVar3 = get_physical_device_details(physicalDevice);
  __dest = (int *)pFeatures->pNext;
  do {
    if (__dest == (int *)0x0) {
      return;
    }
    pvVar4 = (pPVar3->features_pNextChain).
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar1 = (pPVar3->features_pNextChain).
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar4 != pvVar1) {
      do {
        __src = (int *)(pvVar4->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_start;
        if (*__src == *__dest) {
          uVar2 = *(undefined8 *)(__dest + 2);
          memcpy(__dest,__src,
                 (long)(pvVar4->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)__src);
          *(undefined8 *)(__dest + 2) = uVar2;
          break;
        }
        pvVar4 = pvVar4 + 1;
      } while (pvVar4 != pvVar1);
    }
    __dest = *(int **)(__dest + 2);
  } while( true );
}

Assistant:

VKAPI_ATTR void VKAPI_CALL shim_vkGetPhysicalDeviceFeatures2KHR(VkPhysicalDevice physicalDevice, VkPhysicalDeviceFeatures2* pFeatures) {
    pFeatures->features = get_physical_device_details(physicalDevice).features;
    const auto& phys_dev = get_physical_device_details(physicalDevice);
    VkBaseOutStructure* current = static_cast<VkBaseOutStructure*>(pFeatures->pNext);
    while (current) {
        for (const auto& features_pNext : phys_dev.features_pNextChain) {
            VkBaseOutStructure structure_data{};
            memcpy(&structure_data, features_pNext.data(), sizeof(structure_data));
            if (structure_data.sType == current->sType) {
                VkBaseOutStructure* next = static_cast<VkBaseOutStructure*>(current->pNext);
                std::memcpy(static_cast<void*>(current), features_pNext.data(), features_pNext.size());
                // Repair pNext void* since we clobbered it in the memcpy
                current->pNext = next;
                break;
            }
        }
        current = static_cast<VkBaseOutStructure*>(current->pNext);
    }
}